

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManSupportNodes(Aig_Man_t *p,Vec_Ptr_t *vParts)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Int_t *vSupport;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  Aig_ManSetCioIds(p);
  iVar10 = vParts->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar10 - 1U) {
    iVar7 = iVar10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < vParts->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = vParts->pArray[lVar9];
      vSupport = (Vec_Int_t *)malloc(0x10);
      vSupport->nCap = 100;
      vSupport->nSize = 0;
      piVar6 = (int *)malloc(400);
      vSupport->pArray = piVar6;
      Aig_ManIncrementTravId(p);
      p->pConst1->TravId = p->nTravIds;
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar8 = 0;
        do {
          iVar10 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar8 * 4);
          if (((long)iVar10 < 0) || (p->vCos->nSize <= iVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Aig_ManSupportNodes_rec
                    (p,(Aig_Obj_t *)
                       (*(ulong *)((long)p->vCos->pArray[iVar10] + 8) & 0xfffffffffffffffe),vSupport
                    );
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)pvVar3 + 4));
      }
      uVar1 = pVVar4->nSize;
      uVar2 = pVVar4->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar2 * 2;
          if (iVar10 <= (int)uVar2) goto LAB_006c4aef;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar10;
      }
LAB_006c4aef:
      pVVar4->nSize = uVar1 + 1;
      pVVar4->pArray[(int)uVar1] = vSupport;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vParts->nSize);
  }
  Aig_ManCleanCioIds(p);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportNodes( Aig_Man_t * p, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vPartSupps;
    Vec_Int_t * vPart, * vSupport;
    int i, k, iOut;
    Aig_ManSetCioIds( p );
    vPartSupps = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        vSupport = Vec_IntAlloc( 100 );
        Aig_ManIncrementTravId( p );
        Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
        Vec_IntForEachEntry( vPart, iOut, k )
            Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(Aig_ManCo(p, iOut)), vSupport );
//        Vec_IntSort( vSupport, 0 );
        Vec_PtrPush( vPartSupps, vSupport );
    }
    Aig_ManCleanCioIds( p );
    return vPartSupps;
}